

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

bool __thiscall Js::InlinedFrameWalker::Next(InlinedFrameWalker *this,CallInfo *callInfo)

{
  CallInfo CVar1;
  InlinedFrame *pIVar2;
  
  this->currentIndex = this->currentIndex + 1;
  pIVar2 = GetCurrentFrame(this);
  if (pIVar2 != (InlinedFrame *)0x0) {
    CVar1 = *callInfo;
    *callInfo = (CallInfo)((ulong)CVar1 & 0xffffffff00ffffff);
    *callInfo = (CallInfo)
                ((ulong)CVar1 & 0xffffffff00000000 |
                (ulong)(*(uint *)&(pIVar2->super_InlinedFrameLayout).callInfo & 0xf));
  }
  return pIVar2 != (InlinedFrame *)0x0;
}

Assistant:

bool InlinedFrameWalker::Next(CallInfo& callInfo)
    {
        MoveNext();
        InlinedFrameWalker::InlinedFrame *const currentFrame = GetCurrentFrame();
        if (currentFrame)
        {
            callInfo.Flags = CallFlags_None;
            callInfo.Count = (currentFrame->callInfo.Count & 0xFFFF);
        }

        return currentFrame != nullptr;
    }